

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O1

bool __thiscall RTIMUMPU9250::setAccelLpf(RTIMUMPU9250 *this,uchar lpf)

{
  undefined3 in_register_00000031;
  
  if ((6 < CONCAT31(in_register_00000031,lpf)) && (CONCAT31(in_register_00000031,lpf) != 8)) {
    setAccelLpf((RTIMUMPU9250 *)(ulong)lpf);
    return false;
  }
  this->m_accelLpf = lpf;
  return true;
}

Assistant:

bool RTIMUMPU9250::setAccelLpf(unsigned char lpf)
{
    switch (lpf) {
    case MPU9250_ACCEL_LPF_1130:
    case MPU9250_ACCEL_LPF_460:
    case MPU9250_ACCEL_LPF_184:
    case MPU9250_ACCEL_LPF_92:
    case MPU9250_ACCEL_LPF_41:
    case MPU9250_ACCEL_LPF_20:
    case MPU9250_ACCEL_LPF_10:
    case MPU9250_ACCEL_LPF_5:
        m_accelLpf = lpf;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9250 accel lpf %d\n", lpf);
        return false;
    }
}